

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::OutputFile::initialize(OutputFile *this,Header *header)

{
  bool bVar1;
  Format FVar2;
  int iVar3;
  Box2i *pBVar4;
  LineOrder *pLVar5;
  size_t maxScanLineSize;
  Header *pHVar6;
  reference ppLVar7;
  size_type sVar8;
  long in_RDI;
  int lineOffsetSize;
  size_t i_1;
  LineBuffer *lineBuffer;
  size_t i;
  size_t maxBytesPerLine;
  Box2i *dataWindow;
  string *in_stack_00000108;
  Header *in_stack_00000110;
  Compressor *in_stack_ffffffffffffff80;
  value_type in_stack_ffffffffffffff88;
  Array<char> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar9;
  ulong local_48;
  Header *in_stack_ffffffffffffffd8;
  Header *comp;
  Header *hdr;
  Header *in_stack_ffffffffffffffe0;
  
  Header::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bVar1 = Header::hasType((Header *)0x784f8d);
  if (bVar1) {
    Header::setType(in_stack_00000110,in_stack_00000108);
  }
  pBVar4 = Header::dataWindow((Header *)0x784fb2);
  pLVar5 = Header::lineOrder((Header *)0x784fc1);
  if (*pLVar5 == INCREASING_Y) {
    iVar9 = (pBVar4->min).y;
  }
  else {
    iVar9 = (pBVar4->max).y;
  }
  *(int *)(*(long *)(in_RDI + 8) + 0x78) = iVar9;
  *(int *)(*(long *)(in_RDI + 8) + 0x7c) = ((pBVar4->max).y - (pBVar4->min).y) + 1;
  pLVar5 = Header::lineOrder((Header *)0x785014);
  *(LineOrder *)(*(long *)(in_RDI + 8) + 0x80) = *pLVar5;
  *(int *)(*(long *)(in_RDI + 8) + 0x84) = (pBVar4->min).x;
  *(int *)(*(long *)(in_RDI + 8) + 0x88) = (pBVar4->max).x;
  *(int *)(*(long *)(in_RDI + 8) + 0x8c) = (pBVar4->min).y;
  *(int *)(*(long *)(in_RDI + 8) + 0x90) = (pBVar4->max).y;
  maxScanLineSize =
       bytesPerLineTable(in_stack_ffffffffffffffe0,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffffd8);
  comp = (Header *)0x0;
  while (hdr = comp,
        pHVar6 = (Header *)
                 std::
                 vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                 ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                         *)(*(long *)(in_RDI + 8) + 0x108)), comp < pHVar6) {
    in_stack_ffffffffffffff88 = (value_type)operator_new(0x90);
    in_stack_ffffffffffffff90 = (Array<char> *)Header::compression((Header *)0x7850e1);
    in_stack_ffffffffffffff80 =
         newCompressor((Compression)((ulong)pBVar4 >> 0x20),maxScanLineSize,hdr);
    anon_unknown_6::LineBuffer::LineBuffer
              ((LineBuffer *)CONCAT44(iVar9,in_stack_ffffffffffffffa0),(Compressor *)comp);
    ppLVar7 = std::
              vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                            *)(*(long *)(in_RDI + 8) + 0x108),(size_type)hdr);
    *ppLVar7 = in_stack_ffffffffffffff88;
    comp = (Header *)&(hdr->_map)._M_t._M_impl.field_0x1;
  }
  std::
  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                *)(*(long *)(in_RDI + 8) + 0x108),0);
  FVar2 = defaultFormat(in_stack_ffffffffffffff80);
  *(Format *)(*(long *)(in_RDI + 8) + 0xe0) = FVar2;
  iVar3 = numLinesInBuffer(in_stack_ffffffffffffff80);
  *(int *)(*(long *)(in_RDI + 8) + 0x120) = iVar3;
  *(size_t *)(*(long *)(in_RDI + 8) + 0x128) =
       maxScanLineSize * (long)*(int *)(*(long *)(in_RDI + 8) + 0x120);
  for (local_48 = 0;
      sVar8 = std::
              vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                      *)(*(long *)(in_RDI + 8) + 0x108)), local_48 < sVar8; local_48 = local_48 + 1)
  {
    std::
    vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
    ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x108),local_48);
    Array<char>::resizeErase(in_stack_ffffffffffffff90,(long)in_stack_ffffffffffffff88);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(iVar9,in_stack_ffffffffffffffa0),(size_type)comp);
  offsetInLineBufferTable
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff90,
             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void
OutputFile::initialize (const Header &header)
{
    _data->header = header;

    // "fix" the type if it happens to be set incorrectly
    // (attribute is optional, but ensure it is correct if it exists)
    if(_data->header.hasType())
    {
        _data->header.setType(SCANLINEIMAGE);
    }
    
    const Box2i &dataWindow = header.dataWindow();

    _data->currentScanLine = (header.lineOrder() == INCREASING_Y)?
				 dataWindow.min.y: dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder = header.lineOrder();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    size_t maxBytesPerLine = bytesPerLineTable (_data->header,
						_data->bytesPerLine);

    for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
    {
        _data->lineBuffers[i] =
	    new LineBuffer (newCompressor (_data->header.compression(),
					   maxBytesPerLine,
					   _data->header));
    }

    LineBuffer *lineBuffer = _data->lineBuffers[0];
    _data->format = defaultFormat (lineBuffer->compressor);
    _data->linesInBuffer = numLinesInBuffer (lineBuffer->compressor);
    _data->lineBufferSize = maxBytesPerLine * _data->linesInBuffer;

    for (size_t i = 0; i < _data->lineBuffers.size(); i++)
        _data->lineBuffers[i]->buffer.resizeErase(_data->lineBufferSize);

    int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
			  _data->linesInBuffer) / _data->linesInBuffer;

    _data->lineOffsets.resize (lineOffsetSize);
    
    
    offsetInLineBufferTable (_data->bytesPerLine,
			     _data->linesInBuffer,
			     _data->offsetInLineBuffer);
}